

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_dynamic_content.hpp
# Opt level: O3

error_or<int> * __thiscall
pstore::http::handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::__0,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          query_container *param_3)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  time_point time;
  http *this_00;
  __string_type *__return_storage_ptr___00;
  undefined1 auVar5 [16];
  ostringstream os;
  string local_208;
  string local_1e8;
  span<const_unsigned_char,__1L> local_1c8;
  span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::version_abi_cxx11_ == '\0') {
    __return_storage_ptr___00 =
         (__string_type *)
         &handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::version_abi_cxx11_;
    this_00 = this;
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::{lambda()#1}::operator()[abi_cxx11_(__return_storage_ptr___00,this_00);
      __cxa_atexit(std::__cxx11::string::~string,
                   &handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::version_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                           ::version_abi_cxx11_);
    }
  }
  if (handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
      ::modified == '\0') {
    handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::__0,int>();
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HTTP/1.1 200 OK",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Connection: close",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Content-length: ",0x10);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Content-type: application/json",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Date: ",6);
  auVar5 = std::chrono::_V2::system_clock::now();
  http_date_abi_cxx11_(&local_208,auVar5._0_8_,(duration)auVar5._8_8_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Last-Modified: ",0xf);
  http_date_abi_cxx11_
            (&local_1e8,
             (http *)handle_version<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_dynamic_content.cpp:34:19),_int>
                     ::modified.__d.__r,time);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Server: ",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"pstore-http",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::version_abi_cxx11_._M_dataplus._M_p,
             handle_version<ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int>(ServeDynamicContent_BadRequest_Test::TestBody()::$_0,int,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
             ::version_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  _Var1._M_p = local_208._M_dataplus._M_p;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_1c8,local_208._M_string_length);
  local_1c8.storage_.data_ = (pointer)_Var1._M_p;
  pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
  span_iterator((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)&local_1e8,
                &local_1c8,0);
  pstore::gsl::details::span_iterator<pstore::gsl::span<const_unsigned_char,_-1L>,_false>::
  span_iterator(&local_1b8,&local_1c8,local_1c8.storage_.super_extent_type<_1L>.size_);
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char_const,_1l>,false>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((span_iterator<pstore::gsl::span<const_unsigned_char,__1L>,_false> *)&local_1e8,
             &local_1b8,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)this
            );
  __return_storage_ptr__->has_error_ = false;
  piVar4 = error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(__return_storage_ptr__);
  *piVar4 = (int)sender.output;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> handle_version (Sender sender, IO io, query_container const &) {
            auto version_string = [] () {
                std::ostringstream os;
                os << R"({ "version": ")" << header::major_version << '.' << header::minor_version
                   << "\" }";
                auto const & v = os.str ();
                PSTORE_ASSERT (json::is_valid (v));
                return v;
            };
            static std::string const version = version_string ();
            static auto const modified = std::chrono::system_clock::now ();

            std::ostringstream os;
            os << "HTTP/1.1 200 OK" << crlf                                         //
               << "Connection: close" << crlf                                       //
               << "Content-length: " << version.length () << crlf                   //
               << "Content-type: application/json" << crlf                          //
               << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
               << "Last-Modified: " << http_date (modified) << crlf                 //
               << "Server: " << server_name << crlf                                 //
               << crlf // End of headers
               << version;
            return pstore::http::send (sender, io, os.str ());
        }